

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_get_layer_resolution
               (int width_org,int height_org,int num,int den,int *width_out,int *height_out)

{
  int iVar1;
  int iVar2;
  int h;
  int w;
  int *height_out_local;
  int *width_out_local;
  int den_local;
  int num_local;
  int height_org_local;
  int width_org_local;
  
  if (((width_out != (int *)0x0) && (height_out != (int *)0x0)) && (den != 0)) {
    if ((den == 1) && (num == 1)) {
      *width_out = width_org;
      *height_out = height_org;
    }
    else {
      iVar1 = (width_org * num) / den;
      iVar2 = (height_org * num) / den;
      *width_out = iVar1 % 2 + iVar1;
      *height_out = iVar2 % 2 + iVar2;
    }
  }
  return;
}

Assistant:

void av1_get_layer_resolution(const int width_org, const int height_org,
                              const int num, const int den, int *width_out,
                              int *height_out) {
  int w, h;
  if (width_out == NULL || height_out == NULL || den == 0) return;
  if (den == 1 && num == 1) {
    *width_out = width_org;
    *height_out = height_org;
    return;
  }
  w = width_org * num / den;
  h = height_org * num / den;
  // Make height and width even.
  w += w % 2;
  h += h % 2;
  *width_out = w;
  *height_out = h;
}